

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

string * custom_text(string *__return_storage_ptr__,string *text,int color)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  __val = -color;
  if (0 < color) {
    __val = color;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar4 = (uint)uVar7;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_0010b109;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_0010b109;
      }
      if (uVar4 < 10000) goto LAB_0010b109;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar4);
    __len = __len + 1;
  }
LAB_0010b109:
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,(char)__len - (char)(color >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b0[0] + ((uint)color >> 0x1f),__len,__val);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x10e6b3);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(text->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string custom_text(string text,int color){
	return "\033[38;5;"+to_string(color)+"m" + text + "\033[37m";
	}